

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O1

aspa_hop_result aspa_check_hop(aspa_table *aspa_table,uint32_t customer_asn,uint32_t provider_asn)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  aspa_hop_result aVar4;
  aspa_record *paVar5;
  uint32_t *puVar6;
  aspa_hop_result aVar7;
  size_t sVar8;
  ulong uVar9;
  byte bVar10;
  aspa_store_node *paVar11;
  long in_FS_OFFSET;
  bool bVar12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar11 = aspa_table->store;
  bVar12 = paVar11 == (aspa_store_node *)0x0;
  if (bVar12) {
    aVar7 = ASPA_NO_ATTESTATION;
  }
  else {
    bVar10 = 0;
    do {
      paVar5 = aspa_array_search(paVar11->aspa_array,customer_asn);
      if (paVar5 == (aspa_record *)0x0) {
        bVar3 = false;
      }
      else {
        bVar10 = 1;
        bVar3 = false;
        if (paVar5->provider_count != 0) {
          puVar6 = paVar5->provider_asns;
          sVar8 = paVar5->provider_count;
          do {
            uVar9 = sVar8 >> 1;
            if (provider_asn == puVar6[uVar9]) {
              bVar3 = true;
              break;
            }
            if (-1 < (int)(provider_asn - puVar6[uVar9])) {
              puVar6 = puVar6 + uVar9;
            }
            bVar2 = 1 < sVar8;
            sVar8 = sVar8 - uVar9;
          } while (bVar2);
        }
      }
      if (bVar3) break;
      paVar11 = paVar11->next;
      bVar12 = paVar11 == (aspa_store_node *)0x0;
    } while (!bVar12);
    aVar7 = (aspa_hop_result)bVar10;
  }
  aVar4 = ASPA_PROVIDER_PLUS;
  if (bVar12) {
    aVar4 = aVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aVar4;
}

Assistant:

enum aspa_hop_result aspa_check_hop(struct aspa_table *aspa_table, uint32_t customer_asn, uint32_t provider_asn)
{
	bool customer_found = false;

	for (struct aspa_store_node *node = aspa_table->store; node != NULL; node = node->next) {
		struct aspa_record *aspa_record = aspa_array_search(node->aspa_array, customer_asn);

		if (!aspa_record)
			continue;

		customer_found = true;

		// Provider ASNs are sorted in ascending order.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		uint32_t *provider =
			binary_search_asns(provider_asn, aspa_record->provider_asns, aspa_record->provider_count);

		if (provider)
			return ASPA_PROVIDER_PLUS;
	}

	return customer_found ? ASPA_NOT_PROVIDER_PLUS : ASPA_NO_ATTESTATION;
}